

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.h
# Opt level: O2

void __thiscall crnlib::dxt5_block::set_selector(dxt5_block *this,uint x,uint y,uint val)

{
  ulong uVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  
  uVar2 = (x + y * 4) * 3;
  uVar1 = (ulong)(uVar2 >> 3);
  bVar3 = (byte)uVar2 & 7;
  uVar4 = (uint)this->m_selectors[uVar1];
  if (uVar2 < 0x28) {
    uVar4 = (uint)CONCAT11(this->m_selectors[uVar1 + 1],this->m_selectors[uVar1]);
  }
  uVar4 = val << bVar3 | ~(7 << bVar3) & uVar4;
  this->m_selectors[uVar1] = (uint8)uVar4;
  if (uVar2 < 0x28) {
    this->m_selectors[uVar1 + 1] = (uint8)(uVar4 >> 8);
  }
  return;
}

Assistant:

inline void set_selector(uint x, uint y, uint val) {
    CRNLIB_ASSERT((x < 4U) && (y < 4U) && (val < 8U));

    uint selector_index = (y * 4) + x;
    uint bit_index = selector_index * cDXT5SelectorBits;

    uint byte_index = bit_index >> 3;
    uint bit_ofs = bit_index & 7;

    uint v = m_selectors[byte_index];
    if (byte_index < (cNumSelectorBytes - 1))
      v |= (m_selectors[byte_index + 1] << 8);

    v &= (~(7 << bit_ofs));
    v |= (val << bit_ofs);

    m_selectors[byte_index] = static_cast<uint8>(v);
    if (byte_index < (cNumSelectorBytes - 1))
      m_selectors[byte_index + 1] = static_cast<uint8>(v >> 8);
  }